

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test::
iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test
          (iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00398338;
  return;
}

Assistant:

TEST(SyntaxTest, AlmostLongDoubleEq)
{
    if( long double x = 1.0l )
        ASSERT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        EXPECT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        INFORM_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        ASSUME_ALMOST_EQ(1.0l, x);
}